

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_base.c
# Opt level: O0

void lj_ffh_coroutine_wrap_err(lua_State *L,lua_State *co)

{
  lua_State *co_local;
  lua_State *L_local;
  
  co->top = co->top + -1;
  *L->top = *co->top;
  L->top = L->top + 1;
  if ((int)L->top[-1].field_4.it >> 0xf == -5) {
    lj_err_callermsg(L,(char *)((L->top[-1].u64 & 0x7fffffffffff) + 0x18));
  }
  lj_err_run(L);
}

Assistant:

void LJ_FASTCALL lj_ffh_coroutine_wrap_err(lua_State *L, lua_State *co)
{
  co->top--; copyTV(L, L->top, co->top); L->top++;
  if (tvisstr(L->top-1))
    lj_err_callermsg(L, strVdata(L->top-1));
  else
    lj_err_run(L);
}